

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

string * utilSolutionStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,HighsInt solution_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (solution_status == 2) {
    pcVar2 = "Feasible";
    pcVar1 = "";
  }
  else if (solution_status == 1) {
    pcVar2 = "Infeasible";
    pcVar1 = "";
  }
  else if (solution_status == 0) {
    pcVar2 = "None";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unrecognised solution status";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string utilSolutionStatusToString(const HighsInt solution_status) {
  switch (solution_status) {
    case kSolutionStatusNone:
      return "None";
      break;
    case kSolutionStatusInfeasible:
      return "Infeasible";
      break;
    case kSolutionStatusFeasible:
      return "Feasible";
      break;
    default:
      assert(1 == 0);
      return "Unrecognised solution status";
  }
}